

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

void AlphaVectorPlanning::ExportValueFunction
               (string *filename,ValueFunctionPOMDPDiscrete *V,bool includeBGindices)

{
  pointer pAVar1;
  ostream *poVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> values;
  ofstream fp;
  undefined8 auStack_228 [3];
  byte abStack_210 [480];
  
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  lVar3 = *(long *)(_fp + -0x18);
  if ((abStack_210[lVar3] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPlanning::ExportValueFunction: failed to ");
    poVar2 = std::operator<<(poVar2,"open file ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = *(long *)(_fp + -0x18);
  }
  uVar4 = 0;
  *(undefined8 *)((long)auStack_228 + lVar3) = 0x11;
  while( true ) {
    pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pAVar1) / 0x28 == (ulong)uVar4) break;
    std::vector<double,_std::allocator<double>_>::operator=(&values,&pAVar1[uVar4]._m_values);
    uVar6 = (long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    std::ostream::_M_insert<unsigned_long>((ulong)&fp);
    if (includeBGindices) {
      poVar2 = std::operator<<((ostream *)&fp," ");
      std::ostream::_M_insert<long_long>((longlong)poVar2);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
    for (uVar5 = 0; (uVar6 >> 3 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
      std::ostream::_M_insert<double>
                (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
      if ((long)uVar5 < (long)(uVar6 * 0x20000000 + -0x100000000) >> 0x20) {
        std::operator<<((ostream *)&fp," ");
      }
    }
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&fp);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = uVar4 + 1;
  }
  std::ofstream::~ofstream(&fp);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&values.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void
AlphaVectorPlanning::ExportValueFunction(const string & filename,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         bool includeBGindices)
{
    vector<double> values;

    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ExportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    // floating point precision must be digits10 + 2, to ensure that conversions are correct
    int maxPrecision = numeric_limits<double>::digits10 + 2;
    fp.precision(maxPrecision);

    for(unsigned int i=0;i!=V.size();i++)
    {
        values=V[i].GetValues();
        int nrS=values.size();

        fp << V[i].GetAction();
        // this breaks compatability with Cassandra's software
        if(includeBGindices)
            fp << " " << V[i].GetBetaI();
        fp << endl;

        for(int s=0;s!=nrS;s++)
        {
            fp << values[s];
            if(s<(nrS-1))
                fp << " ";
        }
        fp << endl << endl;
    }
}